

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O0

pboolean p_socket_set_buffer_size(PSocket *socket,PSocketDirection dir,psize size,PError **error)

{
  PError **error_00;
  pboolean pVar1;
  int iVar2;
  pint pVar3;
  PErrorIO code;
  undefined4 local_38;
  int local_34;
  pint optval;
  pint optname;
  PError **error_local;
  psize size_local;
  PSocket *pPStack_18;
  PSocketDirection dir_local;
  PSocket *socket_local;
  
  _optval = error;
  error_local = (PError **)size;
  size_local._4_4_ = dir;
  pPStack_18 = socket;
  if (socket == (PSocket *)0x0) {
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
    socket_local._4_4_ = 0;
  }
  else {
    pVar1 = pp_socket_check(socket,error);
    if (pVar1 == 0) {
      socket_local._4_4_ = 0;
    }
    else {
      local_34 = 7;
      if (size_local._4_4_ == P_SOCKET_DIRECTION_RCV) {
        local_34 = 8;
      }
      local_38 = SUB84(error_local,0);
      iVar2 = setsockopt(pPStack_18->fd,1,local_34,&local_38,4);
      error_00 = _optval;
      if (iVar2 == 0) {
        socket_local._4_4_ = 1;
      }
      else {
        pVar3 = p_error_get_last_net();
        code = p_error_get_io_from_system(pVar3);
        pVar3 = p_error_get_last_net();
        p_error_set_error_p(error_00,code,pVar3,
                            "Failed to call setsockopt() on socket to set buffer size");
        socket_local._4_4_ = 0;
      }
    }
  }
  return socket_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_socket_set_buffer_size (const PSocket		*socket,
			  PSocketDirection	dir,
			  psize			size,
			  PError		**error)
{
	pint	optname;
	pint	optval;

	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return FALSE;

	optname = (dir == P_SOCKET_DIRECTION_RCV) ? SO_RCVBUF : SO_SNDBUF;
	optval  = (pint) size;

	if (P_UNLIKELY (setsockopt (socket->fd,
				    SOL_SOCKET,
				    optname,
				    (pconstpointer) &optval,
				    sizeof (optval)) != 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
				     (pint) p_error_get_last_net (),
				     "Failed to call setsockopt() on socket to set buffer size");
		return FALSE;
	}

	return TRUE;
}